

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUint32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDUint32x4Operation::OpLessThanOrEqual(SIMDValue *aValue,SIMDValue *bValue)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  SIMDValue SVar10;
  
  uVar1 = (aValue->field_0).u32[0];
  uVar2 = (aValue->field_0).u32[1];
  uVar3 = (aValue->field_0).u32[2];
  uVar4 = (aValue->field_0).u32[3];
  uVar5 = (bValue->field_0).u32[0];
  uVar6 = (bValue->field_0).u32[1];
  uVar7 = (bValue->field_0).u32[2];
  uVar8 = (bValue->field_0).u32[3];
  auVar9._0_8_ = CONCAT44(-(uint)(((uVar2 < uVar6) * uVar2 | (uVar2 >= uVar6) * uVar6) == uVar2),
                          -(uint)(((uVar1 < uVar5) * uVar1 | (uVar1 >= uVar5) * uVar5) == uVar1));
  auVar9._8_4_ = -(uint)(((uVar3 < uVar7) * uVar3 | (uVar3 >= uVar7) * uVar7) == uVar3);
  auVar9._12_4_ = -(uint)(((uVar4 < uVar8) * uVar4 | (uVar4 >= uVar8) * uVar8) == uVar4);
  SVar10.field_0.i64[1] = auVar9._8_8_;
  SVar10.field_0.i64[0] = auVar9._0_8_;
  return (SIMDValue)SVar10.field_0;
}

Assistant:

SIMDValue SIMDUint32x4Operation::OpLessThanOrEqual(const SIMDValue& aValue, const SIMDValue& bValue)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(aValue);
        X86SIMDValue tmpbValue = X86SIMDValue::ToX86SIMDValue(bValue);
        X86SIMDValue signBits;
        signBits.m128i_value = _mm_set1_epi32(0x80000000);

        // Signed comparison of unsigned ints can be done if the ints have the "sign" bit xored with 1
        tmpaValue.m128i_value = _mm_xor_si128(tmpaValue.m128i_value, signBits.m128i_value);
        tmpbValue.m128i_value = _mm_xor_si128(tmpbValue.m128i_value, signBits.m128i_value);
        x86Result.m128i_value = _mm_cmplt_epi32(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a < b?
        tmpaValue.m128i_value = _mm_cmpeq_epi32(tmpaValue.m128i_value, tmpbValue.m128i_value); // compare a == b?
        x86Result.m128i_value = _mm_or_si128(x86Result.m128i_value, tmpaValue.m128i_value);   // result = (a<b)|(a==b)

        return X86SIMDValue::ToSIMDValue(x86Result);
    }